

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv-transpose-1d.cpp
# Opt level: O1

void load_model(test_model *model,bool use_gpu)

{
  void *pvVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ggml_backend_t pgVar9;
  ggml_backend_buffer_t pgVar10;
  ggml_context *pgVar11;
  ggml_tensor *pgVar12;
  size_t sVar13;
  undefined8 uVar14;
  undefined7 in_register_00000031;
  undefined8 in_R9;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  float bdata_0 [2];
  float adata_0 [3];
  ggml_tallocr alloc;
  float bdata_2 [6];
  float bdata_1 [6];
  float adata_1 [6];
  float adata_2 [12];
  float data [16384];
  undefined4 uVar20;
  undefined4 uVar21;
  undefined8 uStack_10138;
  undefined8 uStack_10130;
  undefined4 uStack_10128;
  undefined1 auStack_10120 [32];
  long lStack_10100;
  long lStack_100f8;
  long lStack_100f0;
  long lStack_100e8;
  long lStack_100e0;
  undefined8 uStack_100d8;
  undefined1 uStack_100d0;
  undefined7 uStack_100cf;
  undefined8 uStack_100c8;
  undefined8 uStack_100c0;
  undefined8 uStack_100b8;
  undefined8 uStack_100a8;
  undefined8 uStack_100a0;
  undefined8 uStack_10098;
  undefined8 uStack_10088;
  undefined8 uStack_10080;
  undefined8 uStack_10078;
  undefined8 uStack_10068;
  undefined8 uStack_10060;
  undefined8 uStack_10058;
  undefined8 uStack_10050;
  undefined8 uStack_10048;
  undefined8 uStack_10040;
  float afStack_10038 [16386];
  
  uStack_10130 = 0x400000003f800000;
  uStack_10128 = 0x40400000;
  uStack_10138 = 0x400000003f800000;
  uStack_10088 = 0x400000003f800000;
  uStack_10080 = 0x4040000040400000;
  uStack_10078 = 0x3f80000040000000;
  uStack_100a8 = 0x4040000040000000;
  uStack_100a0 = 0x3f8000003f800000;
  uStack_10098 = 0x4000000040400000;
  uStack_10048 = 0x4040000040400000;
  uStack_10040 = 0x3f80000040000000;
  uStack_10058 = 0x4040000040000000;
  uStack_10050 = 0x400000003f800000;
  uStack_10068 = 0x4000000040400000;
  uStack_10060 = 0x3f8000003f800000;
  uStack_100b8 = 0x4000000040400000;
  uStack_100c8 = 0x4040000040000000;
  uStack_100c0 = 0x3f8000003f800000;
  uVar16 = 0;
  uVar17 = 1;
  uVar18 = 2;
  uVar19 = 3;
  lVar3 = 0;
  do {
    afStack_10038[lVar3] = (float)(uVar16 & 0x3ff);
    afStack_10038[lVar3 + 1] = (float)(uVar17 & 0x3ff);
    afStack_10038[lVar3 + 2] = (float)(uVar18 & 0x3ff);
    afStack_10038[lVar3 + 3] = (float)(uVar19 & 0x3ff);
    lVar3 = lVar3 + 4;
    uVar16 = uVar16 + (int)DAT_00105030;
    uVar17 = uVar17 + DAT_00105030._4_4_;
    uVar18 = uVar18 + DAT_00105030._8_4_;
    uVar19 = uVar19 + DAT_00105030._12_4_;
  } while (lVar3 != 0x4000);
  lStack_100e8 = ggml_type_size(0,CONCAT71(in_register_00000031,use_gpu));
  lStack_100e8 = lStack_100e8 * 3;
  lStack_100f0 = ggml_type_size(0);
  lStack_100f8 = ggml_type_size(0);
  lVar3 = ggml_type_size(0);
  lStack_10100 = ggml_type_size(0);
  lVar4 = ggml_type_size(0);
  lVar5 = ggml_type_size(0);
  lVar6 = ggml_type_size(0);
  lVar7 = ggml_type_size(0);
  lVar8 = ggml_type_size(0);
  uVar15 = lStack_100e8 + lStack_100f0 * 2 + (lVar5 + lStack_10100) * 0xc + lVar7 * 0x4000 +
           lVar8 * 0x18a0 + (lVar6 + lVar4 + lVar3 + lStack_100f8) * 6 + 0x400;
  printf("%s: ggml tensor size    = %d bytes\n","load_model",0x150);
  printf("%s: backend buffer size = %0.2f MB\n",
         SUB84((double)((float)uVar15 * 0.0009765625 * 0.0009765625),0),"load_model");
  lVar3 = ggml_tensor_overhead();
  ggml_log_set(ggml_log_callback_default,0);
  if (model->backend == (ggml_backend_t)0x0) {
    pgVar9 = (ggml_backend_t)ggml_backend_cpu_init();
    model->backend = pgVar9;
  }
  pgVar10 = (ggml_backend_buffer_t)ggml_backend_alloc_buffer(model->backend,uVar15);
  model->buffer = pgVar10;
  uStack_100d8 = 0;
  uStack_100d0 = 1;
  uVar14 = CONCAT71(uStack_100cf,1);
  lStack_100e0._0_4_ = (undefined4)(lVar3 * 10);
  uStack_100d8._0_4_ = 0;
  uVar20 = (undefined4)lStack_100e0;
  uVar21 = (undefined4)uStack_100d8;
  lStack_100e0 = lVar3 * 10;
  pgVar11 = (ggml_context *)ggml_init();
  model->ctx = pgVar11;
  pgVar12 = (ggml_tensor *)ggml_new_tensor_1d(pgVar11,0,3);
  model->a_0 = pgVar12;
  pgVar12 = (ggml_tensor *)ggml_new_tensor_1d(model->ctx,0,2);
  model->b_0 = pgVar12;
  pgVar12 = (ggml_tensor *)ggml_new_tensor_3d(model->ctx,0,3,1,2,in_R9,uVar20,uVar21,uVar14);
  model->a_1 = pgVar12;
  pgVar12 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx,0,3,2);
  model->b_1 = pgVar12;
  pgVar12 = (ggml_tensor *)ggml_new_tensor_3d(model->ctx,0,3,2,2);
  model->a_2 = pgVar12;
  pgVar12 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx,0,3,2);
  model->b_2 = pgVar12;
  pgVar12 = (ggml_tensor *)ggml_new_tensor_3d(model->ctx,0,2,3,2);
  model->a_3 = pgVar12;
  pgVar12 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx,0,3,2);
  model->b_3 = pgVar12;
  pgVar12 = (ggml_tensor *)ggml_new_tensor_3d(model->ctx,0,0x10,0x20,0x20);
  model->a_4 = pgVar12;
  pgVar12 = (ggml_tensor *)ggml_new_tensor_2d(model->ctx,0,0xc5,0x20);
  model->b_4 = pgVar12;
  ggml_tallocr_new(auStack_10120,model->buffer);
  ggml_tallocr_alloc(auStack_10120,model->a_0);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar12 = model->a_0;
  if (cVar2 == '\0') {
    uVar14 = ggml_nbytes(pgVar12);
    ggml_backend_tensor_set(pgVar12,&uStack_10130,0,uVar14);
  }
  else {
    pvVar1 = pgVar12->data;
    sVar13 = ggml_nbytes(pgVar12);
    memcpy(pvVar1,&uStack_10130,sVar13);
  }
  ggml_tallocr_alloc(auStack_10120,model->a_1);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar12 = model->a_1;
  if (cVar2 == '\0') {
    uVar14 = ggml_nbytes(pgVar12);
    ggml_backend_tensor_set(pgVar12,&uStack_10088,0,uVar14);
  }
  else {
    pvVar1 = pgVar12->data;
    sVar13 = ggml_nbytes(pgVar12);
    memcpy(pvVar1,&uStack_10088,sVar13);
  }
  ggml_tallocr_alloc(auStack_10120,model->a_2);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar12 = model->a_2;
  if (cVar2 == '\0') {
    uVar14 = ggml_nbytes(pgVar12);
    ggml_backend_tensor_set(pgVar12,&uStack_10068,0,uVar14);
  }
  else {
    pvVar1 = pgVar12->data;
    sVar13 = ggml_nbytes(pgVar12);
    memcpy(pvVar1,&uStack_10068,sVar13);
  }
  ggml_tallocr_alloc(auStack_10120,model->a_3);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar12 = model->a_3;
  if (cVar2 == '\0') {
    uVar14 = ggml_nbytes(pgVar12);
    ggml_backend_tensor_set(pgVar12,afStack_10038,0,uVar14);
  }
  else {
    pvVar1 = pgVar12->data;
    sVar13 = ggml_nbytes(pgVar12);
    memcpy(pvVar1,afStack_10038,sVar13);
  }
  ggml_tallocr_alloc(auStack_10120,model->a_4);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar12 = model->a_4;
  if (cVar2 == '\0') {
    uVar14 = ggml_nbytes(pgVar12);
    ggml_backend_tensor_set(pgVar12,afStack_10038,0,uVar14);
  }
  else {
    pvVar1 = pgVar12->data;
    sVar13 = ggml_nbytes(pgVar12);
    memcpy(pvVar1,afStack_10038,sVar13);
  }
  ggml_tallocr_alloc(auStack_10120,model->b_0);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar12 = model->b_0;
  if (cVar2 == '\0') {
    uVar14 = ggml_nbytes(pgVar12);
    ggml_backend_tensor_set(pgVar12,&uStack_10138,0,uVar14);
  }
  else {
    pvVar1 = pgVar12->data;
    sVar13 = ggml_nbytes(pgVar12);
    memcpy(pvVar1,&uStack_10138,sVar13);
  }
  ggml_tallocr_alloc(auStack_10120,model->b_1);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar12 = model->b_1;
  if (cVar2 == '\0') {
    uVar14 = ggml_nbytes(pgVar12);
    ggml_backend_tensor_set(pgVar12,&uStack_100a8,0,uVar14);
  }
  else {
    pvVar1 = pgVar12->data;
    sVar13 = ggml_nbytes(pgVar12);
    memcpy(pvVar1,&uStack_100a8,sVar13);
  }
  ggml_tallocr_alloc(auStack_10120,model->b_2);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar12 = model->b_2;
  if (cVar2 == '\0') {
    uVar14 = ggml_nbytes(pgVar12);
    ggml_backend_tensor_set(pgVar12,&uStack_100c8,0,uVar14);
  }
  else {
    pvVar1 = pgVar12->data;
    sVar13 = ggml_nbytes(pgVar12);
    memcpy(pvVar1,&uStack_100c8,sVar13);
  }
  ggml_tallocr_alloc(auStack_10120,model->b_3);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar12 = model->b_3;
  if (cVar2 == '\0') {
    uVar14 = ggml_nbytes(pgVar12);
    ggml_backend_tensor_set(pgVar12,afStack_10038,0,uVar14);
  }
  else {
    pvVar1 = pgVar12->data;
    sVar13 = ggml_nbytes(pgVar12);
    memcpy(pvVar1,afStack_10038,sVar13);
  }
  ggml_tallocr_alloc(auStack_10120,model->b_4);
  cVar2 = ggml_backend_is_cpu(model->backend);
  pgVar12 = model->b_4;
  if (cVar2 == '\0') {
    uVar14 = ggml_nbytes(pgVar12);
    ggml_backend_tensor_set(pgVar12,afStack_10038,0,uVar14);
  }
  else {
    pvVar1 = pgVar12->data;
    sVar13 = ggml_nbytes(pgVar12);
    memcpy(pvVar1,afStack_10038,sVar13);
  }
  return;
}

Assistant:

void load_model(test_model & model, bool use_gpu = false) {


    float adata_0[] = {1,2,3};
    float bdata_0[] = {1,2};

    float adata_1[] = {1,2,3,3,2,1};
    float bdata_1[] = {2,3,1,1,3,2};

    float adata_2[] =  {3,2,1,1,2,3,1,2,3,3,2,1};
    float bdata_2[] =  {2,3,1,1,3,2};

    float data[16*32*32];
    for (int i = 0; i < 16*32*32; ++i) {
        data[i] = (float)(i%1024);
    }




    size_t buffer_size = 0;
    {
        buffer_size += 3* ggml_type_size(GGML_TYPE_F32); // tensor a_0
        buffer_size += 2* ggml_type_size(GGML_TYPE_F32); // tensor b_0

        buffer_size += 6* ggml_type_size(GGML_TYPE_F32); // tensor a_1
        buffer_size += 6* ggml_type_size(GGML_TYPE_F32); // tensor b_1

        buffer_size += 12* ggml_type_size(GGML_TYPE_F32); // tensor a_2
        buffer_size += 6* ggml_type_size(GGML_TYPE_F32); // tensor b_2

        buffer_size += 2 * 3 * 2 * ggml_type_size(GGML_TYPE_F32); // tensor a_3
        buffer_size += 3 * 2* ggml_type_size(GGML_TYPE_F32); // tensor b_3

        buffer_size += 16 * 32 * 32 * ggml_type_size(GGML_TYPE_F32); // tensor a_4
        buffer_size += 197 * 32* ggml_type_size(GGML_TYPE_F32); // tensor b_4

        buffer_size += 1024;
    }

    printf("%s: ggml tensor size    = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
    printf("%s: backend buffer size = %0.2f MB\n", __func__, (buffer_size/ 1024.f/ 1024.f));

    int num_tensors = 10;
    struct ggml_init_params params {
            /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
    };

    ggml_log_set(ggml_log_callback_default, nullptr);

    // initialize the backend
#ifdef GGML_USE_CUDA
    if (use_gpu) {
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        model.backend = ggml_backend_cuda_init(0);
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
    }
#endif

#ifdef GGML_USE_METAL
    if (use_gpu) {
        fprintf(stderr, "%s: using Metal backend\n", __func__);
        model.backend = ggml_backend_metal_init();
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
        }
    }
#endif

    if(!model.backend) {
        // fallback to CPU backend
        model.backend = ggml_backend_cpu_init();
    }

    model.buffer = ggml_backend_alloc_buffer(model.backend, buffer_size);

    // create context
    model.ctx = ggml_init(params);

    // create tensors
    model.a_0 = ggml_new_tensor_1d(model.ctx, GGML_TYPE_F32, 3);
    model.b_0 = ggml_new_tensor_1d(model.ctx, GGML_TYPE_F32, 2);


    model.a_1 = ggml_new_tensor_3d(model.ctx, GGML_TYPE_F32, 3,1,2);
    model.b_1 = ggml_new_tensor_2d(model.ctx, GGML_TYPE_F32, 3,2);

    model.a_2 = ggml_new_tensor_3d(model.ctx, GGML_TYPE_F32, 3,2,2);
    model.b_2 = ggml_new_tensor_2d(model.ctx, GGML_TYPE_F32, 3,2);

    model.a_3 = ggml_new_tensor_3d(model.ctx, GGML_TYPE_F32, 2,3,2);
    model.b_3 = ggml_new_tensor_2d(model.ctx, GGML_TYPE_F32, 3,2);

    model.a_4 = ggml_new_tensor_3d(model.ctx, GGML_TYPE_F32, 16,32,32);
    model.b_4 = ggml_new_tensor_2d(model.ctx, GGML_TYPE_F32, 197,32);


    // create a allocator
    ggml_tallocr alloc = ggml_tallocr_new(model.buffer);

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.a_0);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a_0->data, adata_0, ggml_nbytes(model.a_0));
    } else {
        ggml_backend_tensor_set(model.a_0, adata_0, 0, ggml_nbytes(model.a_0));
    }


    // alloc memory
    ggml_tallocr_alloc(&alloc, model.a_1);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a_1->data, adata_1, ggml_nbytes(model.a_1));
    } else {
        ggml_backend_tensor_set(model.a_1, adata_1, 0, ggml_nbytes(model.a_1));
    }

     // alloc memory
    ggml_tallocr_alloc(&alloc, model.a_2);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a_2->data, adata_2, ggml_nbytes(model.a_2));
    } else {
        ggml_backend_tensor_set(model.a_2, adata_2, 0, ggml_nbytes(model.a_2));
    }

      // alloc memory
    ggml_tallocr_alloc(&alloc, model.a_3);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a_3->data, data, ggml_nbytes(model.a_3));
    } else {
        ggml_backend_tensor_set(model.a_3, data, 0, ggml_nbytes(model.a_3));
    }


      // alloc memory
    ggml_tallocr_alloc(&alloc, model.a_4);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a_4->data, data, ggml_nbytes(model.a_4));
    } else {
        ggml_backend_tensor_set(model.a_4, data, 0, ggml_nbytes(model.a_4));
    }



    // alloc memory
    ggml_tallocr_alloc(&alloc, model.b_0);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b_0->data, bdata_0, ggml_nbytes(model.b_0));
    } else {
        ggml_backend_tensor_set(model.b_0, bdata_0, 0, ggml_nbytes(model.b_0));
    }

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.b_1);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b_1->data, bdata_1, ggml_nbytes(model.b_1));
    } else {
        ggml_backend_tensor_set(model.b_1, bdata_1, 0, ggml_nbytes(model.b_1));
    }

     // alloc memory
    ggml_tallocr_alloc(&alloc, model.b_2);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b_2->data, bdata_2, ggml_nbytes(model.b_2));
    } else {
        ggml_backend_tensor_set(model.b_2, bdata_2, 0, ggml_nbytes(model.b_2));
    }

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.b_3);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b_3->data, data, ggml_nbytes(model.b_3));
    } else {
        ggml_backend_tensor_set(model.b_3, data, 0, ggml_nbytes(model.b_3));
    }


   // alloc memory
    ggml_tallocr_alloc(&alloc, model.b_4);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b_4->data, data, ggml_nbytes(model.b_4));
    } else {
        ggml_backend_tensor_set(model.b_4, data, 0, ggml_nbytes(model.b_4));
    }


}